

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.h
# Opt level: O0

bool asmjit::_abi_1_10::ZoneAllocator::_getSlotIndex
               (size_t size,uint32_t *slot,size_t *allocatedSize)

{
  unsigned_long uVar1;
  unsigned_long *in_RDX;
  int *in_RSI;
  ulong in_RDI;
  char *in_stack_000003d0;
  int in_stack_000003dc;
  char *in_stack_000003e0;
  undefined1 local_1;
  
  if (in_RDI == 0) {
    DebugUtils::assertionFailed(in_stack_000003e0,in_stack_000003dc,in_stack_000003d0);
  }
  if (in_RDI < 0x201) {
    if (in_RDI < 0x81) {
      *in_RSI = (int)(in_RDI - 1 >> 5);
      uVar1 = Support::alignUp<unsigned_long,asmjit::_abi_1_10::ZoneAllocator::_unnamed_type_1_>
                        (in_RDI,kBlockAlignment);
      *in_RDX = uVar1;
    }
    else {
      *in_RSI = (int)(in_RDI - 0x81 >> 6) + 4;
      uVar1 = Support::alignUp<unsigned_long,asmjit::_abi_1_10::ZoneAllocator::_unnamed_type_1_>
                        (in_RDI,kHiGranularity);
      *in_RDX = uVar1;
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static inline bool _getSlotIndex(size_t size, uint32_t& slot, size_t& allocatedSize) noexcept {
    ASMJIT_ASSERT(size > 0);
    if (size > kHiMaxSize)
      return false;

    if (size <= kLoMaxSize) {
      slot = uint32_t((size - 1) / kLoGranularity);
      allocatedSize = Support::alignUp(size, kLoGranularity);
    }
    else {
      slot = uint32_t((size - kLoMaxSize - 1) / kHiGranularity) + kLoCount;
      allocatedSize = Support::alignUp(size, kHiGranularity);
    }

    return true;
  }